

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledHorizontal.cpp
# Opt level: O1

bool __thiscall
Rml::DecoratorTiledHorizontal::Initialise
          (DecoratorTiledHorizontal *this,Tile *_tiles,Texture *_textures)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  undefined4 *puVar4;
  undefined4 *puVar5;
  long lVar6;
  TextureFileIndex *pTVar7;
  byte bVar8;
  Texture texture;
  
  bVar8 = 0;
  pTVar7 = &_textures->file_index;
  lVar6 = 0x30;
  do {
    puVar4 = (undefined4 *)((long)(&_tiles->tile_data + -3) + lVar6);
    puVar5 = (undefined4 *)
             ((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar6);
    for (lVar3 = 0x13; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar5 = *puVar4;
      puVar4 = puVar4 + (ulong)bVar8 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    }
    texture._8_8_ = *(undefined8 *)pTVar7;
    texture.render_manager = ((Texture *)(pTVar7 + -2))->render_manager;
    iVar2 = Decorator::AddTexture((Decorator *)this,texture);
    *(int *)((long)&(this->super_DecoratorTiled).super_Decorator._vptr_Decorator + lVar6) = iVar2;
    pTVar7 = pTVar7 + 4;
    lVar6 = lVar6 + 0x4c;
  } while (lVar6 != 0x114);
  uVar1 = *(uint *)&this->field_0x30;
  if ((uVar1 == 0xffffffff) && (-1 < *(int *)&this->field_0x7c)) {
    puVar4 = (undefined4 *)&this->field_0x7c;
    puVar5 = (undefined4 *)&this->field_0x30;
    for (lVar6 = 0x13; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar5 = *puVar4;
      puVar4 = puVar4 + (ulong)bVar8 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    }
    *(undefined4 *)&this->field_0x64 = 1;
  }
  else if ((int)uVar1 < 0 || *(uint *)&this->field_0x7c != 0xffffffff) {
    if ((*(uint *)&this->field_0x7c & uVar1) == 0xffffffff) {
      return false;
    }
  }
  else {
    puVar4 = (undefined4 *)&this->field_0x30;
    puVar5 = (undefined4 *)&this->field_0x7c;
    for (lVar6 = 0x13; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar5 = *puVar4;
      puVar4 = puVar4 + (ulong)bVar8 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    }
    *(undefined4 *)&this->field_0xb0 = 1;
  }
  return *(int *)&this->field_0xc8 != -1;
}

Assistant:

bool DecoratorTiledHorizontal::Initialise(const Tile* _tiles, const Texture* _textures)
{
	// Load the textures.
	for (int i = 0; i < 3; i++)
	{
		tiles[i] = _tiles[i];
		tiles[i].texture_index = AddTexture(_textures[i]);
	}

	// If only one side of the decorator has been configured, then mirror the texture for the other side.
	if (tiles[LEFT].texture_index == -1 && tiles[RIGHT].texture_index > -1)
	{
		tiles[LEFT] = tiles[RIGHT];
		tiles[LEFT].orientation = FLIP_HORIZONTAL;
	}
	else if (tiles[RIGHT].texture_index == -1 && tiles[LEFT].texture_index > -1)
	{
		tiles[RIGHT] = tiles[LEFT];
		tiles[RIGHT].orientation = FLIP_HORIZONTAL;
	}
	else if (tiles[LEFT].texture_index == -1 && tiles[RIGHT].texture_index == -1)
		return false;

	if (tiles[CENTRE].texture_index == -1)
		return false;

	return true;
}